

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O0

void ncnn::convdw3x3s2_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  reference pvVar1;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  Mat *in_R8;
  int sum;
  int remain;
  int i;
  char *r2;
  char *r1;
  char *r0;
  char *img0;
  char *kernel0;
  float scale_dequant;
  float bias0;
  float *outptr;
  Mat out;
  int p;
  float *bias;
  char *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int w;
  char *in_stack_fffffffffffffeb0;
  int _c;
  undefined4 in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  int local_130;
  int local_12c;
  char *local_128;
  char *local_120;
  char *local_118;
  Mat local_100;
  char *local_c0;
  char *local_b8;
  value_type local_b0;
  float local_ac;
  float *local_a8;
  Mat local_a0;
  int local_5c;
  float *local_58;
  char *local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  Mat *local_20;
  
  local_34 = *(int *)(in_RDI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x2c);
  local_3c = *(int *)(in_RSI + 0x30);
  local_40 = *(int *)(in_RSI + 0x34);
  local_44 = local_34 * 2 + local_38 * -2;
  local_20 = in_RCX;
  local_50 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_58 = Mat::operator_cast_to_float_(local_20);
  for (local_5c = 0; _c = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20), local_5c < local_40;
      local_5c = local_5c + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),_c);
    local_a8 = Mat::operator_cast_to_float_(&local_a0);
    if (local_58 == (float *)0x0) {
      in_stack_fffffffffffffebc = 0.0;
    }
    else {
      in_stack_fffffffffffffebc = local_58[local_5c];
    }
    local_ac = in_stack_fffffffffffffebc;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)in_R8,(long)local_5c);
    local_b0 = *pvVar1;
    Mat::fill(in_R8,in_stack_fffffffffffffebc);
    local_b8 = local_50 + local_5c * 9;
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),_c);
    in_stack_fffffffffffffeb0 = Mat::operator_cast_to_signed_char_(&local_100);
    Mat::~Mat((Mat *)0x18cdab);
    local_120 = in_stack_fffffffffffffeb0 + local_34;
    local_128 = in_stack_fffffffffffffeb0 + (local_34 << 1);
    local_118 = in_stack_fffffffffffffeb0;
    for (local_12c = 0; local_12c < local_3c; local_12c = local_12c + 1) {
      for (local_130 = local_38; 0 < local_130; local_130 = local_130 + -1) {
        *local_a8 = (float)((int)local_128[2] * (int)local_b8[8] +
                           (int)local_128[1] * (int)local_b8[7] +
                           (int)*local_128 * (int)local_b8[6] +
                           (int)local_120[2] * (int)local_b8[5] +
                           (int)local_120[1] * (int)local_b8[4] +
                           (int)*local_120 * (int)local_b8[3] +
                           (int)local_118[2] * (int)local_b8[2] +
                           (int)local_118[1] * (int)local_b8[1] + (int)*local_118 * (int)*local_b8)
                    * local_b0 + *local_a8;
        local_118 = local_118 + 2;
        local_120 = local_120 + 2;
        local_128 = local_128 + 2;
        local_a8 = local_a8 + 1;
      }
      local_118 = local_118 + local_44;
      local_120 = local_120 + local_44;
      local_128 = local_128 + local_44;
    }
    local_c0 = in_stack_fffffffffffffeb0;
    Mat::~Mat((Mat *)0x18d03b);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char *kernel0 = (const signed char *)kernel + p * 9;
        
        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}